

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O3

bool __thiscall
crnlib::find_files::find_internal
          (find_files *this,char *pBasepath,char *pRelpath,char *pFilespec,uint flags,int level)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  DIR *__dirp;
  dirent *pdVar7;
  file_desc *pfVar8;
  uint uVar9;
  file_desc *pfVar10;
  long lVar11;
  char *pcVar12;
  find_files *pfVar13;
  ulong uVar14;
  uint uVar15;
  file_desc *pfVar16;
  dynamic_string_array paths;
  dynamic_string filename;
  dynamic_string pathname;
  elemental_vector local_a8;
  dynamic_string local_98;
  dynamic_string local_88;
  find_files *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  char *local_58;
  ulong local_50;
  DIR *local_48;
  dynamic_string local_40;
  
  local_88.m_buf_size = 0;
  local_88.m_len = 0;
  local_88.m_pStr = (char *)0x0;
  local_78 = this;
  local_60 = pRelpath;
  local_58 = pFilespec;
  if (*pRelpath == '\0') {
    dynamic_string::set(&local_88,pBasepath,0xffffffff);
  }
  else {
    file_utils::combine_path(&local_88,pBasepath,pRelpath);
  }
  if ((local_88.m_len != 0) && (local_88.m_pStr[local_88.m_len - 1] != '/')) {
    dynamic_string::append(&local_88,"/");
  }
  pcVar12 = local_88.m_pStr;
  if (local_88.m_pStr == (char *)0x0) {
    pcVar12 = "";
  }
  __dirp = opendir(pcVar12);
  if (__dirp == (DIR *)0x0) {
    bVar5 = level != 0;
  }
  else {
    local_a8.m_p = (void *)0x0;
    local_a8.m_size = 0;
    local_a8.m_capacity = 0;
    local_6c = level;
    local_68 = pBasepath;
    local_48 = __dirp;
    while (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0) {
      if ((pdVar7->d_name[0] != '.') ||
         ((pdVar7->d_name[1] != '\0' && ((pdVar7->d_name[1] != '.' || (pdVar7->d_name[2] != '\0'))))
         )) {
        bVar1 = pdVar7->d_type;
        dynamic_string::dynamic_string(&local_98,pdVar7->d_name);
        if (((flags & 1) != 0) && ((bVar1 & 4) != 0)) {
          if (local_a8.m_capacity <= local_a8.m_size) {
            elemental_vector::increase_capacity
                      (&local_a8,local_a8.m_size + 1,true,0x10,(object_mover)0x0,false);
          }
          dynamic_string::dynamic_string
                    ((dynamic_string *)((ulong)local_a8.m_size * 0x10 + (long)local_a8.m_p),
                     &local_98);
          local_a8.m_size = local_a8.m_size + 1;
        }
        if (((byte)((byte)flags >> 2 & (byte)((bVar1 & 8) >> 3)) != 0) ||
           ((flags & 2) != 0 && (bVar1 & 4) != 0)) {
          pcVar12 = local_98.m_pStr;
          if (local_98.m_pStr == (char *)0x0) {
            pcVar12 = "";
          }
          iVar6 = fnmatch(local_58,pcVar12,0);
          if (iVar6 == 0) {
            uVar15 = (local_78->m_files).m_size;
            uVar14 = (ulong)uVar15;
            uVar15 = uVar15 + 1;
            if (uVar15 == 0) {
              pfVar8 = (local_78->m_files).m_p;
              lVar11 = 0x47ffffffb8;
              local_50 = uVar14;
              do {
                file_desc::~file_desc(pfVar8);
                pfVar8 = pfVar8 + 1;
                lVar11 = lVar11 + -0x48;
              } while (lVar11 != 0);
              pfVar16 = (local_78->m_files).m_p;
              uVar14 = local_50;
              pfVar13 = local_78;
            }
            else {
              if ((local_78->m_files).m_capacity < uVar15) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)local_78,uVar15,true,0x48,
                           vector<crnlib::find_files::file_desc>::object_mover,false);
                uVar2 = (local_78->m_files).m_size;
                pfVar16 = (local_78->m_files).m_p;
                uVar9 = uVar15 - uVar2;
                pfVar13 = local_78;
                if (uVar9 == 0) goto LAB_00118475;
                pfVar8 = pfVar16 + uVar2;
                pfVar10 = pfVar8 + uVar9;
              }
              else {
                pfVar16 = (local_78->m_files).m_p;
                pfVar8 = pfVar16 + uVar14;
                pfVar10 = pfVar16 + uVar14 + 1;
                pfVar13 = local_78;
              }
              do {
                (pfVar8->m_fullname).m_buf_size = 0;
                (pfVar8->m_fullname).m_len = 0;
                (pfVar8->m_fullname).m_pStr = (char *)0x0;
                (pfVar8->m_base).m_buf_size = 0;
                (pfVar8->m_base).m_len = 0;
                (pfVar8->m_base).m_pStr = (char *)0x0;
                (pfVar8->m_rel).m_buf_size = 0;
                (pfVar8->m_rel).m_len = 0;
                (pfVar8->m_rel).m_pStr = (char *)0x0;
                (pfVar8->m_name).m_buf_size = 0;
                (pfVar8->m_name).m_len = 0;
                (pfVar8->m_name).m_pStr = (char *)0x0;
                pfVar8->m_is_dir = false;
                pfVar8 = pfVar8 + 1;
              } while (pfVar8 != pfVar10);
            }
LAB_00118475:
            (pfVar13->m_files).m_size = uVar15;
            pfVar16[uVar14].m_is_dir = SUB41((bVar1 & 4) >> 2,0);
            dynamic_string::set(&pfVar16[uVar14].m_base,local_68,0xffffffff);
            pfVar16 = pfVar16 + uVar14;
            dynamic_string::set(&pfVar16->m_rel,local_60,0xffffffff);
            dynamic_string::set(&pfVar16->m_name,&local_98,0xffffffff);
            operator+((crnlib *)&local_40,&local_88,&local_98);
            dynamic_string::set(&pfVar16->m_fullname,&local_40,0xffffffff);
            __dirp = local_48;
            if ((local_40.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff))
            {
              crnlib_free(local_40.m_pStr + -0x10);
            }
          }
        }
        if ((local_98.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_98.m_pStr + -8) ^ *(uint *)(local_98.m_pStr + -4)) == 0xffffffff)) {
          crnlib_free(local_98.m_pStr + -0x10);
        }
      }
    }
    closedir(__dirp);
    bVar5 = true;
    if (((flags & 1) != 0) && (local_a8.m_size != 0)) {
      iVar6 = local_6c + 1;
      lVar11 = 0;
      uVar14 = 0;
      do {
        local_98.m_buf_size = 0;
        local_98.m_len = 0;
        local_98.m_pStr = (char *)0x0;
        if (*local_60 == '\0') {
          dynamic_string::set(&local_98,(dynamic_string *)((long)local_a8.m_p + lVar11),0xffffffff);
        }
        else {
          pcVar12 = *(char **)((long)local_a8.m_p + lVar11 + 8);
          if (pcVar12 == (char *)0x0) {
            pcVar12 = "";
          }
          file_utils::combine_path(&local_98,local_60,pcVar12);
        }
        pcVar12 = local_98.m_pStr;
        if (local_98.m_pStr == (char *)0x0) {
          pcVar12 = "";
        }
        bVar5 = find_internal(local_78,local_68,pcVar12,local_58,flags,iVar6);
        if ((local_98.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_98.m_pStr + -8) ^ *(uint *)(local_98.m_pStr + -4)) == 0xffffffff)) {
          crnlib_free(local_98.m_pStr + -0x10);
        }
        if (!bVar5) break;
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar14 < (local_a8._8_8_ & 0xffffffff));
    }
    pvVar4 = local_a8.m_p;
    if (local_a8.m_p != (void *)0x0) {
      uVar14 = local_a8._8_8_ & 0xffffffff;
      if (uVar14 != 0) {
        lVar11 = 0;
        do {
          lVar3 = *(long *)((long)pvVar4 + lVar11 + 8);
          if ((lVar3 != 0) && ((*(uint *)(lVar3 + -8) ^ *(uint *)(lVar3 + -4)) == 0xffffffff)) {
            crnlib_free((void *)(lVar3 + -0x10));
          }
          lVar11 = lVar11 + 0x10;
        } while (uVar14 << 4 != lVar11);
      }
      crnlib_free(local_a8.m_p);
    }
  }
  if ((local_88.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_88.m_pStr + -8) ^ *(uint *)(local_88.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_88.m_pStr + -0x10);
  }
  return bVar5;
}

Assistant:

bool find_files::find_internal(const char* pBasepath, const char* pRelpath, const char* pFilespec, uint flags, int level)
    {
        dynamic_string pathname;
        if (strlen(pRelpath))
        {
            file_utils::combine_path(pathname, pBasepath, pRelpath);
        }
        else
        {
            pathname = pBasepath;
        }

        if (!pathname.is_empty())
        {
            char c = pathname.back();
            if (c != '/')
            {
                pathname += "/";
            }
        }

        DIR* dp = opendir(pathname.get_ptr());

        if (!dp)
        {
            return level ? true : false;
        }

        dynamic_string_array paths;

        for (;;)
        {
            struct dirent* ep = readdir(dp);
            if (!ep)
            {
                break;
            }
            if ((strcmp(ep->d_name, ".") == 0) || (strcmp(ep->d_name, "..") == 0))
            {
                continue;
            }

            const bool is_directory = (ep->d_type & DT_DIR) != 0;
            const bool is_file = (ep->d_type & DT_REG) != 0;

            dynamic_string filename(ep->d_name);

            if (is_directory)
            {
                if (flags & cFlagRecursive)
                {
                    paths.push_back(filename);
                }
            }

            if (((is_file) && (flags & cFlagAllowFiles)) || ((is_directory) && (flags & cFlagAllowDirs)))
            {
                if (0 == fnmatch(pFilespec, filename.get_ptr(), 0))
                {
                    m_files.resize(m_files.size() + 1);
                    file_desc& file = m_files.back();
                    file.m_is_dir = is_directory;
                    file.m_base = pBasepath;
                    file.m_rel = pRelpath;
                    file.m_name = filename;
                    file.m_fullname = pathname + filename;
                }
            }
        }

        closedir(dp);
        dp = nullptr;

        if (flags & cFlagRecursive)
        {
            for (uint i = 0; i < paths.size(); i++)
            {
                dynamic_string childpath;
                if (strlen(pRelpath))
                {
                    file_utils::combine_path(childpath, pRelpath, paths[i].get_ptr());
                }
                else
                {
                    childpath = paths[i];
                }

                if (!find_internal(pBasepath, childpath.get_ptr(), pFilespec, flags, level + 1))
                {
                    return false;
                }
            }
        }

        return true;
    }